

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O2

char * parse_name(char *src)

{
  long lVar1;
  bool bVar2;
  runtime_error *this;
  long lVar3;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    bVar2 = is_word_char(src[lVar3]);
    lVar1 = lVar3 + 1;
  } while (bVar2);
  if (lVar3 + 1 != 1) {
    return src + lVar3;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"expecting name at ",&local_59);
  std::operator+(&local_38,&local_58,src);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static const char * parse_name(const char * src) {
    const char * pos = src;
    while (is_word_char(*pos)) {
        pos++;
    }
    if (pos == src) {
        throw std::runtime_error(std::string("expecting name at ") + src);
    }
    return pos;
}